

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall Function_Pool::FunctionTask::_task(FunctionTask *this,size_t taskId)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference pvVar5;
  pointer pIVar6;
  pointer pOVar7;
  char *message;
  size_type in_RSI;
  long in_RDI;
  char *in_stack_fffffffffffffc98;
  imageException *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffd50;
  uint32_t in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd5c;
  undefined1 horizontal;
  uint32_t in_stack_fffffffffffffd60;
  uint32_t in_stack_fffffffffffffd64;
  Image *in_stack_fffffffffffffd68;
  uint32_t in_stack_fffffffffffffd70;
  uint32_t in_stack_fffffffffffffd74;
  value_type vVar8;
  uint32_t in_stack_fffffffffffffd78;
  value_type vVar9;
  uint32_t in_stack_fffffffffffffd7c;
  Image *in_stack_fffffffffffffd80;
  Image *pIVar10;
  uint32_t in_stack_fffffffffffffd88;
  uint32_t in_stack_fffffffffffffd8c;
  uint32_t in_stack_fffffffffffffd90;
  uint32_t in_stack_fffffffffffffd94;
  Image *in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined8 in_stack_fffffffffffffda8;
  uint8_t uVar11;
  uint32_t in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  uint32_t in_stack_fffffffffffffdb8;
  uint32_t in_stack_fffffffffffffdbc;
  Image *in_stack_fffffffffffffdc0;
  uint8_t maxThreshold;
  uint32_t in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  uint32_t in_stack_fffffffffffffdd8;
  uint32_t in_stack_fffffffffffffde0;
  value_type height;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  uint32_t in_stack_fffffffffffffdf8;
  uint32_t in_stack_fffffffffffffe00;
  uint32_t in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe10;
  
  uVar2 = (uint32_t)in_stack_fffffffffffffdd0;
  switch(*(undefined4 *)(in_RDI + 0xa0)) {
  case 0:
    uVar3 = __cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    __cxa_throw(uVar3,&imageException::typeinfo,imageException::~imageException);
  case 1:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x1499c5);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x1499e5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149a12);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x149a43);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149a63);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149a90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x149ac1);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x149ad9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x149aff);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149b30);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149b61);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::AbsoluteDifference
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8,
               (Image *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (uint32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               (uint32_t)in_stack_fffffffffffffda8,
               (Image *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,
               in_stack_fffffffffffffe10);
    break;
  case 2:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x149be9);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149c09);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149c36);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x149c67);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149c87);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149cb4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x149ce5);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x149cfd);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x149d23);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149d54);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149d85);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::BitwiseAnd
              ((Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdc8,uVar2,in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
    break;
  case 3:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x149e0d);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149e2d);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149e5a);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x149e8b);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149eab);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149ed8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x149f09);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x149f21);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x149f47);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149f78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x149fa9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::BitwiseOr((Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,
                        in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                        in_stack_fffffffffffffd78,in_stack_fffffffffffffdc0,
                        in_stack_fffffffffffffdc8,uVar2,in_stack_fffffffffffffdd8,
                        in_stack_fffffffffffffde0);
    break;
  case 4:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a031);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a051);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a07e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a0af);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a0cf);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a0fc);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14a12d);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a145);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a16b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a19c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a1cd);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::BitwiseXor
              ((Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdc8,uVar2,in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
    break;
  case 5:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a255);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a275);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a2a2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14a2d3);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a2f3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a320);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a351);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a382);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::ConvertToGrayScale
              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,
               (Image *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd80,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdb8);
    break;
  case 6:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a3f4);
    uVar2 = (uint32_t)in_stack_fffffffffffffd98;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a414);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a441);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14a472);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a492);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a4bf);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a4f0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a521);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::ConvertToRgb
              ((Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd90,uVar2);
    break;
  case 7:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a593);
    uVar11 = (uint8_t)in_stack_fffffffffffffdb0;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a5b3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a5e0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14a611);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a631);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a65e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a68f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a6c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::ExtractChannel
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
               (Image *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd68,in_stack_fffffffffffffda0,
               (uint32_t)in_stack_fffffffffffffda8,uVar11);
  case 8:
    uVar2 = (uint32_t)in_stack_fffffffffffffda8;
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a745);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a765);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a792);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14a7c3);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a7e3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14a810);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a841);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a872);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::GammaCorrection
              ((Image *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd80,
               (Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffda0,uVar2,
               (double)in_stack_fffffffffffffd68,
               (double)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    break;
  case 9:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14a8fe);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a91e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a94b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a97c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14a9ad);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(in_RDI + 0xe0),in_RSI);
    penguinV::Histogram(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
                        in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                        in_stack_fffffffffffffd70,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffd68);
    break;
  case 10:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14aa2c);
    uVar2 = (uint32_t)in_stack_fffffffffffffd98;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14aa4c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14aa79);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14aaaa);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14aaca);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14aaf7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ab28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ab59);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::Invert((Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                     in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,in_stack_fffffffffffffd90,
                     uVar2);
    break;
  case 0xb:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14abcb);
    uVar2 = (uint32_t)in_stack_fffffffffffffd98;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14abeb);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ac18);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14ac49);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ac69);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ac96);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14acc7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14acf8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    bVar1 = penguinV::IsEqual((Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                              ,in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
                              in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                              in_stack_fffffffffffffd60,in_stack_fffffffffffffd90,uVar2);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x128),
                        in_RSI);
    *pvVar4 = bVar1;
    break;
  case 0xc:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14ad9c);
    uVar2 = (uint32_t)in_stack_fffffffffffffda8;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14adbc);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ade9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14ae1a);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14ae3a);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14ae67);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ae98);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14aec9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::LookupTable
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
               (Image *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd68,in_stack_fffffffffffffda0,uVar2,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    break;
  case 0xd:
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14af57);
    pIVar10 = pIVar6->image;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14af77);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    vVar8 = *pvVar5;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14afa4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14afd5);
    uVar2 = (uint32_t)pIVar6->image;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14aff5);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    vVar9 = *pvVar5;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b022);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14b053);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b06b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b091);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(pOVar7->super_AreaInfo).startY,in_RSI);
    height = *pvVar5;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b0c2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b0f3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::Maximum((Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                      in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                      in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,pIVar10,vVar8,uVar2,vVar9,
                      height);
    break;
  case 0xe:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14b17b);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b19b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b1c8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14b1f9);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b219);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b246);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14b277);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b28f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b2b5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b2e6);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b317);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::Minimum((Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                      in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                      in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,in_stack_fffffffffffffdc0,
                      in_stack_fffffffffffffdc8,uVar2,in_stack_fffffffffffffdd8,
                      in_stack_fffffffffffffde0);
    break;
  case 0xf:
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b39f);
    horizontal = (undefined1)(in_stack_fffffffffffffd5c >> 0x18);
    pIVar10 = pIVar6->image;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b3bf);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b3ec);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b41d);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b44e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(in_RDI + 0xf8),in_RSI);
    penguinV::ProjectionProfile
              ((Image *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               (uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
               (uint32_t)in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
               in_stack_fffffffffffffd60,(bool)horizontal,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar10);
    break;
  case 0x10:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14b4ef);
    uVar2 = (uint32_t)in_stack_fffffffffffffdc0;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b50f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b53c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b56d);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b59e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14b5cf);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b5ef);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b615);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(pOVar7->super_AreaInfo).startY,in_RSI);
    vVar8 = *pvVar5;
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b646);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(pOVar7->super_AreaInfo).width,in_RSI);
    vVar9 = *pvVar5;
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b677);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).height,in_RSI);
    penguinV::Resize((Image *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                     (uint32_t)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,vVar9,
                     (Image *)CONCAT44(vVar8,in_stack_fffffffffffffd70),in_stack_fffffffffffffdb0,
                     in_stack_fffffffffffffdb8,uVar2,in_stack_fffffffffffffdc8);
    break;
  case 0x11:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14b6f9);
    uVar2 = (uint32_t)in_stack_fffffffffffffd98;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b719);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b746);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14b777);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b797);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b7c4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b7f5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b826);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::RgbToBgr((Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                       in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68
                       ,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60,
                       in_stack_fffffffffffffd90,uVar2);
    break;
  case 0x12:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14b898);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b8b8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b8e5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14b916);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b936);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14b963);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14b994);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b9ac);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14b9d2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ba03);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14ba34);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::Subtract((Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78,
                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8,uVar2,
                       in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
    break;
  case 0x13:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14babc);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14badc);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bb09);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bb3a);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bb6b);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    uVar2 = penguinV::Sum((Image *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                          in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58,
                          (uint32_t)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                          (uint32_t)in_stack_fffffffffffffd50);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x110),
                        in_RSI);
    *pvVar5 = uVar2;
    break;
  case 0x14:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14bbed);
    uVar11 = (uint8_t)in_stack_fffffffffffffdd0;
    uVar2 = (uint32_t)in_stack_fffffffffffffdc0;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bc0a);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bc34);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14bc62);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14bc7f);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14bca9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bcd7);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bd05);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::Threshold((Image *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                        (uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffd98,
                        (Image *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,uVar2,
                        in_stack_fffffffffffffdc8,uVar11);
    break;
  case 0x15:
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                *)0x14bd7a);
    maxThreshold = (uint8_t)in_stack_fffffffffffffdc8;
    uVar11 = (uint8_t)in_stack_fffffffffffffdc0;
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bd97);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar6,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14bdc1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).startY,in_RSI);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                  *)0x14bdef);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14be0c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pOVar7,in_RSI);
    pOVar7 = std::
             unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                           *)0x14be36);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pOVar7->super_AreaInfo).startY,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14be64);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).width,in_RSI);
    pIVar6 = std::
             unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             ::operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                           *)0x14be8e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&(pIVar6->super_AreaInfo).height,in_RSI);
    penguinV::Threshold((Image *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                        (uint32_t)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                        (uint32_t)in_stack_fffffffffffffd80,
                        (Image *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                        in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,uVar11,maxThreshold);
    break;
  default:
    message = (char *)__cxa_allocate_exception(0x28);
    imageException::imageException(in_stack_fffffffffffffca0,message);
    __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
  }
  return;
}

Assistant:

virtual void _task( size_t taskId )
        {
            switch( functionId ) {
                case _none:
                    throw imageException( "Image function task is not setup" );
                case _AbsoluteDifference:
                    penguinV::AbsoluteDifference(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _BitwiseAnd:
                    penguinV::BitwiseAnd( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                          _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                          _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                          _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _BitwiseOr:
                    penguinV::BitwiseOr( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                         _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _BitwiseXor:
                    penguinV::BitwiseXor( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                          _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                          _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                          _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ConvertToGrayScale:
                    penguinV::ConvertToGrayScale( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                                  _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                                  _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ConvertToRgb:
                    penguinV::ConvertToRgb( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                            _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                            _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ExtractChannel:
                    penguinV::ExtractChannel(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.extractChannelId );
                case _GammaCorrection:
                    penguinV::GammaCorrection(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.coefficientA,
                        _dataIn.coefficientGamma );
                    break;
                case _Histogram:
                    penguinV::Histogram( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId], _dataOut.histogram[taskId] );
                    break;
                case _Invert:
                    penguinV::Invert( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                      _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                      _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _IsEqual:
                    _dataOut.equality[taskId] = penguinV::IsEqual(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _LookupTable:
                    penguinV::LookupTable( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                           _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                           _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.lookupTable );
                    break;
                case _Maximum:
                    penguinV::Maximum( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                       _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                       _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                       _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Minimum:
                    penguinV::Minimum( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                       _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                       _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                       _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _ProjectionProfile:
                    penguinV::ProjectionProfile(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId],
                        _dataIn.horizontalProjection, _dataOut.projection[taskId] );
                    break;
                case _Resize:
                    penguinV::Resize( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                      _infoIn1->width[taskId], _infoIn1->height[taskId],
                                      _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                      _infoOut->width[taskId], _infoOut->height[taskId] );
                    break;
                case _RgbToBgr:
                    penguinV::RgbToBgr( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Subtract:
                    penguinV::Subtract( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                        _infoIn2->image, _infoIn2->startX[taskId], _infoIn2->startY[taskId],
                                        _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Sum:
                    _dataOut.sum[taskId] = penguinV::Sum(
                        _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                        _infoIn1->width[taskId], _infoIn1->height[taskId] );
                    break;
                case _Threshold:
                    penguinV::Threshold( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.minThreshold );
                    break;
                case _ThresholdDouble:
                    penguinV::Threshold( _infoIn1->image, _infoIn1->startX[taskId], _infoIn1->startY[taskId],
                                         _infoOut->image, _infoOut->startX[taskId], _infoOut->startY[taskId],
                                         _infoIn1->width[taskId], _infoIn1->height[taskId], _dataIn.minThreshold,
                                         _dataIn.maxThreshold );
                    break;
                default:
                    throw imageException( "Unknown image function task" );
            }
        }